

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

uint Ivy_TruthDsdCompute_rec(int iNode,Vec_Int_t *vTree)

{
  int m;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int Var0;
  int Var1;
  int VarC;
  uint uTruthChild0;
  uint uTruthChild1;
  uint uTruthChildC;
  Ivy_Dec_t Node;
  int i;
  int Var;
  uint uTruthTotal;
  uint uTruthChild;
  Vec_Int_t *vTree_local;
  int iNode_local;
  
  m = Vec_IntEntry(vTree,iNode);
  uTruthChild1 = (uint)Ivy_IntToDec(m);
  if ((uTruthChild1 & 0xf) == 1) {
    vTree_local._4_4_ = s_Masks[5][(int)(uint)(((uTruthChild1 >> 4 & 1) != 0 ^ 0xffU) & 1)];
  }
  else if ((uTruthChild1 & 0xf) == 0) {
    vTree_local._4_4_ = s_Masks[iNode][(int)(uint)(((uTruthChild1 >> 4 & 1) != 0 ^ 0xffU) & 1)];
  }
  else if ((uTruthChild1 & 0xf) == 2) {
    local_48 = Ivy_TruthDsdCompute_rec((int)(uTruthChild1 >> 8 & 0xf) >> 1,vTree);
    if ((uTruthChild1 >> 4 & 1) != 0) {
      local_48 = local_48 ^ 0xffffffff;
    }
    vTree_local._4_4_ = local_48;
  }
  else if ((uTruthChild1 & 0xf) == 3) {
    i = s_Masks[5][1];
    for (uTruthChildC = 0; (int)uTruthChildC < (int)(uTruthChild1 >> 5 & 7);
        uTruthChildC = uTruthChildC + 1) {
      Node = (Ivy_Dec_t)Ivy_DecGetVar((Ivy_Dec_t *)&uTruthChild1,uTruthChildC);
      local_4c = Ivy_TruthDsdCompute_rec((int)Node >> 1,vTree);
      if (((uint)Node & 1) != 0) {
        local_4c = local_4c ^ 0xffffffff;
      }
      local_4c = i & local_4c;
      i = local_4c;
    }
    if ((uTruthChild1 >> 4 & 1) == 0) {
      local_50 = i;
    }
    else {
      local_50 = i ^ 0xffffffff;
    }
    vTree_local._4_4_ = local_50;
  }
  else if ((uTruthChild1 & 0xf) == 4) {
    i = 0;
    for (uTruthChildC = 0; (int)uTruthChildC < (int)(uTruthChild1 >> 5 & 7);
        uTruthChildC = uTruthChildC + 1) {
      Node = (Ivy_Dec_t)Ivy_DecGetVar((Ivy_Dec_t *)&uTruthChild1,uTruthChildC);
      uVar1 = Ivy_TruthDsdCompute_rec((int)Node >> 1,vTree);
      i = uVar1 ^ i;
      if (((uint)Node & 1) != 0) {
        __assert_fail("(Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x1b6,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
      }
    }
    if ((uTruthChild1 >> 4 & 1) == 0) {
      local_54 = i;
    }
    else {
      local_54 = i ^ 0xffffffff;
    }
    vTree_local._4_4_ = local_54;
  }
  else {
    if ((uTruthChild1 >> 4 & 1) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x1ba,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    if (((uTruthChild1 & 0xf) != 5) && ((uTruthChild1 & 0xf) != 6)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x1ce,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    uVar1 = Ivy_DecGetVar((Ivy_Dec_t *)&uTruthChild1,0);
    uVar2 = Ivy_DecGetVar((Ivy_Dec_t *)&uTruthChild1,1);
    uVar3 = Ivy_DecGetVar((Ivy_Dec_t *)&uTruthChild1,2);
    local_58 = Ivy_TruthDsdCompute_rec((int)uVar1 >> 1,vTree);
    local_5c = Ivy_TruthDsdCompute_rec((int)uVar2 >> 1,vTree);
    local_60 = Ivy_TruthDsdCompute_rec((int)uVar3 >> 1,vTree);
    if (((uTruthChild1 & 0xf) != 6) && ((uVar1 & 1) != 0)) {
      __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x1c5,"unsigned int Ivy_TruthDsdCompute_rec(int, Vec_Int_t *)");
    }
    if ((uVar1 & 1) != 0) {
      local_58 = local_58 ^ 0xffffffff;
    }
    if ((uVar2 & 1) != 0) {
      local_5c = local_5c ^ 0xffffffff;
    }
    if ((uVar3 & 1) != 0) {
      local_60 = local_60 ^ 0xffffffff;
    }
    if ((uTruthChild1 & 0xf) == 5) {
      vTree_local._4_4_ = local_58 & local_5c | (local_58 ^ 0xffffffff) & local_60;
    }
    else {
      vTree_local._4_4_ = local_58 & (local_5c | local_60) | local_5c & local_60;
    }
  }
  return vTree_local._4_4_;
}

Assistant:

unsigned Ivy_TruthDsdCompute_rec( int iNode, Vec_Int_t * vTree )
{
    unsigned uTruthChild, uTruthTotal;
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return s_Masks[5][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_PI )
        return s_Masks[iNode][ !Node.fCompl ];
    if ( Node.Type == IVY_DEC_BUF )
    {
        uTruthTotal = Ivy_TruthDsdCompute_rec( Node.Fan0 >> 1, vTree );
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_AND )
    {
        uTruthTotal = s_Masks[5][1];
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthChild = Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            uTruthTotal = (Var & 1)? uTruthTotal & ~uTruthChild : uTruthTotal & uTruthChild;
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    if ( Node.Type == IVY_DEC_EXOR )
    {
        uTruthTotal = 0;
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            uTruthTotal ^= Ivy_TruthDsdCompute_rec( Var >> 1, vTree );
            assert( (Var & 1) == 0 );
        }
        return Node.fCompl? ~uTruthTotal : uTruthTotal;
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        unsigned uTruthChildC, uTruthChild1, uTruthChild0;
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        uTruthChildC = Ivy_TruthDsdCompute_rec( VarC >> 1, vTree );
        uTruthChild1 = Ivy_TruthDsdCompute_rec( Var1 >> 1, vTree );
        uTruthChild0 = Ivy_TruthDsdCompute_rec( Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        uTruthChildC = (VarC & 1)? ~uTruthChildC : uTruthChildC;
        uTruthChild1 = (Var1 & 1)? ~uTruthChild1 : uTruthChild1;
        uTruthChild0 = (Var0 & 1)? ~uTruthChild0 : uTruthChild0;
        if ( Node.Type == IVY_DEC_MUX )
            return (uTruthChildC & uTruthChild1) | (~uTruthChildC & uTruthChild0);
        else
            return (uTruthChildC & uTruthChild1) | (uTruthChildC & uTruthChild0) | (uTruthChild1 & uTruthChild0);
    }
    assert( 0 );
    return 0;
}